

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O3

ze_result_t zeEventGetEventPool(ze_event_handle_t hEvent,ze_event_pool_handle_t *phEventPool)

{
  code *UNRECOVERED_JUMPTABLE;
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (ze_lib::destruction == '\0') {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(ze_lib::context + 0x10) + 0x4d8);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar1 = (*UNRECOVERED_JUMPTABLE)();
      return zVar1;
    }
    zVar1 = (uint)*(byte *)(ze_lib::context + 0xd90) * 2 + ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return zVar1;
}

Assistant:

ze_result_t ZE_APICALL
zeEventGetEventPool(
    ze_event_handle_t hEvent,                       ///< [in] handle of the event
    ze_event_pool_handle_t* phEventPool             ///< [out] handle of the event pool for the event
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnEventGetEventPool_t pfnGetEventPool = [&result] {
        auto pfnGetEventPool = ze_lib::context->zeDdiTable.load()->Event.pfnGetEventPool;
        if( nullptr == pfnGetEventPool ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetEventPool;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetEventPool( hEvent, phEventPool );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetEventPool = ze_lib::context->zeDdiTable.load()->Event.pfnGetEventPool;
    if( nullptr == pfnGetEventPool ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetEventPool( hEvent, phEventPool );
    #endif
}